

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O0

UBool __thiscall icu_63::TimeZoneRule::operator==(TimeZoneRule *this,TimeZoneRule *that)

{
  bool bVar1;
  UBool UVar2;
  bool local_29;
  bool local_19;
  TimeZoneRule *that_local;
  TimeZoneRule *this_local;
  
  local_19 = true;
  if (this != that) {
    if (this == (TimeZoneRule *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)(this->super_UObject)._vptr_UObject[-1],
                       (type_info *)(that->super_UObject)._vptr_UObject[-1]);
    local_29 = false;
    if (bVar1) {
      UVar2 = UnicodeString::operator==(&this->fName,&that->fName);
      local_29 = false;
      if ((UVar2 != '\0') && (local_29 = false, this->fRawOffset == that->fRawOffset)) {
        local_29 = this->fDSTSavings == that->fDSTSavings;
      }
    }
    local_19 = local_29;
  }
  return local_19;
}

Assistant:

UBool
TimeZoneRule::operator==(const TimeZoneRule& that) const {
    return ((this == &that) ||
            (typeid(*this) == typeid(that) &&
            fName == that.fName &&
            fRawOffset == that.fRawOffset &&
            fDSTSavings == that.fDSTSavings));
}